

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O2

void __thiscall
HighsHashTree<int,_int>::InnerLeaf<2>::InnerLeaf<3>(InnerLeaf<2> *this,InnerLeaf<3> *other)

{
  int iVar1;
  
  (this->occupation).occupation = (other->occupation).occupation;
  iVar1 = other->size;
  this->size = iVar1;
  if (iVar1 + 1 != 0) {
    memmove(&this->hashes,&other->hashes,(long)(iVar1 + 1) << 3);
  }
  if (iVar1 != 0) {
    memmove(&this->entries,&other->entries,(long)iVar1 << 3);
    return;
  }
  return;
}

Assistant:

InnerLeaf(InnerLeaf<kOtherSize>&& other) {
      assert(other.size <= capacity());
      occupation = other.occupation;
      size = other.size;
      std::copy(other.hashes.cbegin(),
                std::next(other.hashes.cbegin(), size + 1), hashes.begin());
      std::move(other.entries.begin(), std::next(other.entries.begin(), size),
                entries.begin());
    }